

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR get_argument(lysp_yang_ctx *ctx,yang_arg arg,uint16_t *flags,char **word_p,char **word_b,
                   size_t *word_len)

{
  uint64_t *puVar1;
  char cVar2;
  ly_in *plVar3;
  LY_ERR LVar4;
  char *pcVar5;
  int iVar6;
  ly_ctx *plVar7;
  char *pcVar8;
  uint8_t comment;
  size_t buf_len;
  uint8_t prefix;
  
  buf_len = 0;
  prefix = '\0';
  *word_b = (char *)0x0;
  *word_p = (char *)0x0;
  *word_len = 0;
LAB_0016ac5b:
  do {
    while( true ) {
      while( true ) {
        plVar3 = ctx->in;
        pcVar5 = plVar3->current;
        cVar2 = *pcVar5;
        if (cVar2 != '\t') break;
        if (*word_len != 0) goto LAB_0016b469;
        ctx->indent = ctx->indent + 8;
        plVar3->current = pcVar5 + 1;
      }
      if (cVar2 != '\n') break;
LAB_0016ad42:
      if (*word_len != 0) {
LAB_0016b469:
        if (*word_b == (char *)0x0) {
          return LY_SUCCESS;
        }
        pcVar5 = (char *)ly_realloc(*word_b,*word_len + 1);
        *word_b = pcVar5;
        if (pcVar5 != (char *)0x0) {
          pcVar5[*word_len] = '\0';
          *word_p = *word_b;
          return LY_SUCCESS;
        }
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","get_argument");
        return LY_EMEM;
      }
      plVar3 = ctx->in;
      puVar1 = &plVar3->line;
      *puVar1 = *puVar1 + 1;
      ly_in_skip(plVar3,1);
      ctx->indent = 0;
    }
    if (cVar2 == '\r') {
      if (pcVar5[1] == '\n') {
        ly_in_skip(plVar3,1);
        ctx->indent = ctx->indent + 1;
        goto LAB_0016ad42;
      }
      ly_vlog((ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
              (char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",0xd);
LAB_0016aef0:
      LVar4 = LY_EVALID;
      goto LAB_0016aef9;
    }
    if (cVar2 == ' ') {
      if (*word_len != 0) goto LAB_0016b469;
      ly_in_skip(plVar3,1);
      ctx->indent = ctx->indent + 1;
      goto LAB_0016ac5b;
    }
    if (cVar2 != '/') {
      if (cVar2 == '\0') {
        ly_vlog((ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                (char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
        goto LAB_0016aef0;
      }
      if (cVar2 == '\"') {
LAB_0016ad9c:
        if (*word_len == 0) {
          if (flags != (uint16_t *)0x0) {
            *flags = *flags | (ushort)(cVar2 != '\'') * 0x100 + 0x100;
          }
          if (*pcVar5 == '\'') {
            iVar6 = 1;
          }
          else {
            if (*pcVar5 != '\"') {
              __assert_fail("ctx->in->current[0] == \'\\\'\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                            ,0x158,
                            "LY_ERR read_qstring(struct lysp_yang_ctx *, enum yang_arg, char **, char **, size_t *, size_t *)"
                           );
            }
            iVar6 = 2;
          }
          ly_in_skip(plVar3,1);
          ctx->indent = ctx->indent + 1;
          if (*ctx->in->current != '\0') {
            LVar4 = (*(code *)((long)&DAT_001c9348 + (long)(int)(&DAT_001c9348)[iVar6 - 1]))();
            return LVar4;
          }
          if ((Y_PREF_IDENTIF_ARG < arg) || (*word_len != 0)) {
            if (*word_p == (char *)0x0) {
              *word_p = "";
            }
            goto LAB_0016b469;
          }
          ly_vlog((ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                  (char *)0x0,LYVE_SYNTAX_YANG,"Statement argument is required.");
          LVar4 = LY_EVALID;
          goto LAB_0016aef9;
        }
LAB_0016ada6:
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        pcVar8 = "unquoted string character, optsep, semicolon or opening brace";
      }
      else {
        if (cVar2 == '}') goto LAB_0016ada6;
        if ((cVar2 != ';') && (cVar2 != '{')) {
          if (cVar2 != '\'') goto LAB_0016ad05;
          goto LAB_0016ad9c;
        }
        if ((arg == Y_MAYBE_STR_ARG) || (*word_len != 0)) goto LAB_0016b469;
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        pcVar8 = "an argument";
      }
      ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",1,
              pcVar5,pcVar8);
      goto LAB_0016aef0;
    }
    if (pcVar5[1] == '/') {
      comment = '\x01';
LAB_0016ad69:
      if (*word_len != 0) {
        ly_vlog((ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                (char *)0x0,LYVE_SYNTAX,"Invalid comment sequence \"%.2s\" in an unquoted string.",
                pcVar5);
        goto LAB_0016aef0;
      }
      ly_in_skip(plVar3,2);
      ctx->indent = ctx->indent + 2;
      LVar4 = skip_comment(ctx,comment);
    }
    else {
      if (pcVar5[1] == '*') {
        comment = '\x02';
        goto LAB_0016ad69;
      }
LAB_0016ad05:
      LVar4 = buf_store_char(ctx,arg,word_p,word_len,word_b,&buf_len,'\0',&prefix);
    }
    if (LVar4 != LY_SUCCESS) {
LAB_0016aef9:
      free(*word_b);
      *word_b = (char *)0x0;
      return LVar4;
    }
  } while( true );
}

Assistant:

LY_ERR
get_argument(struct lysp_yang_ctx *ctx, enum yang_arg arg, uint16_t *flags, char **word_p,
        char **word_b, size_t *word_len)
{
    LY_ERR ret;
    size_t buf_len = 0;
    uint8_t prefix = 0;
    ly_bool str_end = 0;
    int comment;

    /* word buffer - dynamically allocated */
    *word_b = NULL;

    /* word pointer - just a pointer to data */
    *word_p = NULL;

    *word_len = 0;
    while (!str_end) {
        switch (ctx->in->current[0]) {
        case '\'':
        case '\"':
            if (*word_len) {
                /* invalid - quotes cannot be in unquoted string and only optsep, ; or { can follow it */
                LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                        "unquoted string character, optsep, semicolon or opening brace");
                ret = LY_EVALID;
                goto error;
            }
            if (flags) {
                (*flags) |= (ctx->in->current[0] == '\'') ? LYS_SINGLEQUOTED : LYS_DOUBLEQUOTED;
            }

            LY_CHECK_GOTO(ret = read_qstring(ctx, arg, word_p, word_b, word_len, &buf_len), error);
            if (!*word_p) {
                /* do not return NULL word */
                *word_p = "";
            }
            str_end = 1;
            break;
        case '/':
            comment = 0;
            if (ctx->in->current[1] == '/') {
                /* one-line comment */
                comment = 1;
            } else if (ctx->in->current[1] == '*') {
                /* block comment */
                comment = 2;
            } else {
                /* not a comment after all */
                LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            }

            if (comment) {
                if (*word_len) {
                    /* invalid comment sequence (RFC 7950 sec. 6.1.3.) */
                    LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Invalid comment sequence \"%.2s\" in an unquoted string.", ctx->in->current);
                    ret = LY_EVALID;
                    goto error;
                }

                /* skip the comment */
                MOVE_INPUT(ctx, 2);
                LY_CHECK_GOTO(ret = skip_comment(ctx, comment), error);
            }
            break;
        case ' ':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            MOVE_INPUT(ctx, 1);
            break;
        case '\t':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            /* tabs count for 8 spaces */
            ctx->indent += Y_TAB_SPACES;

            ++ctx->in->current;
            break;
        case '\r':
            if (ctx->in->current[1] != '\n') {
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[0]);
                ret = LY_EVALID;
                goto error;
            }
            MOVE_INPUT(ctx, 1);
        /* fallthrough */
        case '\n':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            LY_IN_NEW_LINE(ctx->in);
            MOVE_INPUT(ctx, 1);

            /* reset indent */
            ctx->indent = 0;
            break;
        case ';':
        case '{':
            if (*word_len || (arg == Y_MAYBE_STR_ARG)) {
                /* word is finished */
                str_end = 1;
                break;
            }

            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current, "an argument");
            ret = LY_EVALID;
            goto error;
        case '}':
            /* invalid - braces cannot be in unquoted string (opening braces terminates the string and can follow it) */
            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                    "unquoted string character, optsep, semicolon or opening brace");
            ret = LY_EVALID;
            goto error;
        case '\0':
            /* unexpected EOF */
            LOGVAL_PARSER(ctx, LY_VCODE_EOF);
            ret = LY_EVALID;
            goto error;
        default:
            LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            break;
        }
    }

    /* terminating NULL byte for buf */
    if (*word_b) {
        (*word_b) = ly_realloc(*word_b, (*word_len) + 1);
        LY_CHECK_ERR_RET(!(*word_b), LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
        (*word_b)[*word_len] = '\0';
        *word_p = *word_b;
    }

    return LY_SUCCESS;

error:
    free(*word_b);
    *word_b = NULL;
    return ret;
}